

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O3

int priv_decode_gost(EVP_PKEY *pk,PKCS8_PRIV_KEY_INFO *p8inf)

{
  uchar uVar1;
  uchar *puVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  ASN1_OCTET_STRING *a;
  undefined8 uVar7;
  BIGNUM *pBVar8;
  MASKED_GOST_KEY *a_00;
  ASN1_INTEGER *ai;
  EC_KEY *key;
  long len;
  uint len_00;
  int priv_len;
  uchar *pkey_buf;
  X509_ALGOR *palg;
  ASN1_OBJECT *palg_obj;
  int local_4c;
  uchar *local_48;
  uchar *local_40;
  X509_ALGOR *local_38;
  ASN1_OBJECT *local_30;
  
  local_40 = (uchar *)0x0;
  local_4c = 0;
  local_38 = (X509_ALGOR *)0x0;
  local_30 = (ASN1_OBJECT *)0x0;
  iVar5 = PKCS8_pkey_get0(&local_30,&local_40,&local_4c,&local_38,(PKCS8_PRIV_KEY_INFO *)p8inf);
  puVar2 = local_40;
  if (iVar5 == 0) {
    return 0;
  }
  local_48 = local_40;
  iVar5 = decode_gost_algor_params(pk,(X509_ALGOR *)local_38);
  if (iVar5 == 0) {
    return 0;
  }
  iVar5 = pkey_bits_gost(pk);
  if (0 < iVar5) {
    iVar5 = pkey_bits_gost(pk);
    uVar3 = (ushort)iVar5;
    uVar4 = uVar3;
    if ((short)uVar3 < 0) {
      uVar4 = uVar3 + 7;
    }
    if (0xe < (ushort)(uVar3 + 7)) {
      len_00 = (uint)(int)(short)uVar4 >> 3 & 0xffff;
      len = (long)local_4c;
      if (local_4c % (int)len_00 == 0) {
        pBVar8 = (BIGNUM *)unmask_priv_key(pk,local_40,len_00,local_4c / (int)len_00 + -1);
      }
      else {
        uVar1 = *puVar2;
        if (uVar1 == '\x02') {
          ai = d2i_ASN1_INTEGER((ASN1_INTEGER **)0x0,&local_48,len);
          if (ai == (ASN1_INTEGER *)0x0) {
            iVar5 = 0x276;
            goto LAB_0010e9b2;
          }
          pBVar8 = (BIGNUM *)BN_secure_new();
          pBVar8 = ASN1_INTEGER_to_BN(ai,pBVar8);
          ASN1_INTEGER_free(ai);
        }
        else if (uVar1 == '0') {
          a_00 = d2i_MASKED_GOST_KEY((MASKED_GOST_KEY **)0x0,&local_48,len);
          if (a_00 == (MASKED_GOST_KEY *)0x0) {
            iVar5 = 0x27f;
LAB_0010e9b2:
            ERR_GOST_error(0x85,0x72,
                           "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ameth.c"
                           ,iVar5);
            return 0;
          }
          local_4c = a_00->masked_priv_key->length;
          if (local_4c % (int)len_00 != 0) {
            MASKED_GOST_KEY_free(a_00);
            iVar5 = 0x286;
            goto LAB_0010e9b2;
          }
          pBVar8 = (BIGNUM *)
                   unmask_priv_key(pk,a_00->masked_priv_key->data,len_00,local_4c / (int)len_00 + -1
                                  );
          MASKED_GOST_KEY_free(a_00);
        }
        else {
          if (uVar1 != '\x04') {
            iVar5 = 0x28f;
            goto LAB_0010e80d;
          }
          a = d2i_ASN1_OCTET_STRING((ASN1_OCTET_STRING **)0x0,&local_48,len);
          if ((a == (ASN1_OCTET_STRING *)0x0) ||
             ((iVar5 = a->length, iVar5 != 0x40 && (iVar5 != 0x20)))) {
            ASN1_STRING_free(a);
            iVar5 = 0x26e;
            goto LAB_0010e9b2;
          }
          puVar2 = a->data;
          uVar7 = BN_secure_new();
          pBVar8 = (BIGNUM *)BN_lebin2bn(puVar2,iVar5,uVar7);
          ASN1_STRING_free(a);
        }
      }
      if (pBVar8 != (BIGNUM *)0x0) {
        iVar5 = EVP_PKEY_get_base_id(pk);
        iVar6 = 0;
        if (((iVar5 - 0x3d3U < 2) || (iVar5 == 0x331)) || (iVar5 == 0x32b)) {
          key = (EC_KEY *)EVP_PKEY_get0((EVP_PKEY *)pk);
          if (key == (EC_KEY *)0x0) {
            key = EC_KEY_new();
            iVar5 = EVP_PKEY_get_base_id(pk);
            EVP_PKEY_assign((EVP_PKEY *)pk,iVar5,key);
          }
          iVar5 = EC_KEY_set_private_key(key,pBVar8);
          if (iVar5 != 0) {
            iVar5 = EVP_PKEY_missing_parameters((EVP_PKEY *)pk);
            iVar6 = 1;
            if (iVar5 == 0) {
              iVar6 = gost_ec_compute_public((EC_KEY *)key);
            }
          }
        }
        BN_free(pBVar8);
        return iVar6;
      }
      iVar5 = 0x294;
      goto LAB_0010e80d;
    }
  }
  iVar5 = 0x261;
LAB_0010e80d:
  ERR_GOST_error(0x85,0x72,
                 "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ameth.c"
                 ,iVar5);
  return 0;
}

Assistant:

static int priv_decode_gost(EVP_PKEY *pk,
                            const PKCS8_PRIV_KEY_INFO *p8inf)
{
    const unsigned char *pkey_buf = NULL, *p = NULL;
    int priv_len = 0;
    BIGNUM *pk_num = NULL;
    int ret = 0;
    const X509_ALGOR *palg = NULL;
    const ASN1_OBJECT *palg_obj = NULL;
    ASN1_INTEGER *priv_key = NULL;
    int expected_key_len;

    if (!PKCS8_pkey_get0(&palg_obj, &pkey_buf, &priv_len, &palg, p8inf))
        return 0;
    p = pkey_buf;
    if (!decode_gost_algor_params(pk, palg)) {
        return 0;
    }

    expected_key_len = pkey_bits_gost(pk) > 0 ? pkey_bits_gost(pk) / 8 : 0;
    if (expected_key_len == 0) {
        GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
        return 0;
    }

    if (priv_len % expected_key_len == 0) {
        /* Key is not wrapped but masked */
        pk_num = unmask_priv_key(pk, pkey_buf, expected_key_len,
                                 priv_len / expected_key_len - 1);
    } else if (V_ASN1_OCTET_STRING == *p) {
        /* New format - Little endian octet string */
        ASN1_OCTET_STRING *s = d2i_ASN1_OCTET_STRING(NULL, &p, priv_len);
        if (!s || ((s->length != 32) && (s->length != 64))) {
            ASN1_STRING_free(s);
            GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
            return 0;
        }
        pk_num = BN_lebin2bn(s->data, s->length, BN_secure_new());
        ASN1_STRING_free(s);
    } else if (V_ASN1_INTEGER == *p) {
        priv_key = d2i_ASN1_INTEGER(NULL, &p, priv_len);
        if (!priv_key) {
            GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
            return 0;
        }
        pk_num = ASN1_INTEGER_to_BN(priv_key, BN_secure_new());
        ASN1_INTEGER_free(priv_key);
    } else if ((V_ASN1_SEQUENCE | V_ASN1_CONSTRUCTED) == *p) {
        MASKED_GOST_KEY *mgk = d2i_MASKED_GOST_KEY(NULL, &p, priv_len);

        if (!mgk) {
            GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
            return 0;
        }

        priv_len = mgk->masked_priv_key->length;
        if (priv_len % expected_key_len) {
            MASKED_GOST_KEY_free(mgk);
            GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
            return 0;
        }

        pk_num = unmask_priv_key(pk, mgk->masked_priv_key->data,
                                 expected_key_len,
                                 priv_len / expected_key_len - 1);
        MASKED_GOST_KEY_free(mgk);
    } else {
        GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
        return 0;
    }

    if (pk_num == NULL) {
        GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
        return 0;
    }

    ret = gost_set_priv_key(pk, pk_num);
    BN_free(pk_num);
    return ret;
}